

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Dependency>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> values)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  Dependency *__dest;
  size_t amount;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar2;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> local_48;
  Dependency *local_38;
  size_t local_30;
  
  AVar2.size_ = values.size_;
  if (AVar2.size_ == 0) {
    __dest = (Dependency *)0x0;
  }
  else {
    amount = AVar2.size_ << 4;
    pAVar1 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .rows.builder.ptr;
    table.size_ = (size_t)pAVar1;
    table.ptr = (ArrayPtr<const_unsigned_char> *)
                &(this->dedupTable).
                 super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 .indexes;
    local_38 = values.ptr;
    local_30 = amount;
    kj::HashIndex<kj::_::HashSetCallbacks>::
    find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
              ((HashIndex<kj::_::HashSetCallbacks> *)&local_48,table,
               (ArrayPtr<const_unsigned_char> *)
               ((long)(this->dedupTable).
                      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                      .rows.builder.pos - (long)pAVar1 >> 4));
    pAVar1 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .rows.builder.ptr;
    if ((pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0 & (byte)local_48.ptr) == 1) {
      __dest = (Dependency *)pAVar1[local_48.size_].ptr;
    }
    else {
      __dest = (Dependency *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
      memcpy(__dest,values.ptr,amount);
      local_48.ptr = (uchar *)__dest;
      local_48.size_ = amount;
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_48);
    }
  }
  AVar2.ptr = __dest;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_MAYBE(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe->begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}